

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

void eval_residual(double *coeffs,double *rgb,double *residual)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  int j_1;
  double (*padVar4) [283];
  int i;
  long lVar5;
  long lVar6;
  double *pdVar7;
  int j;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double out [3];
  double local_28 [3];
  
  local_28[2] = 0.0;
  padVar4 = rgb_tbl;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  for (lVar5 = 0; lVar5 != 0x11b; lVar5 = lVar5 + 1) {
    auVar10._0_8_ = (lambda_tbl[lVar5] + -360.0) / 470.0;
    auVar10._8_8_ = 0;
    auVar8 = ZEXT816(0);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = coeffs[lVar6];
      auVar8 = vfmadd213sd_fma(auVar8,auVar10,auVar1);
    }
    auVar10 = vfmadd213sd_fma(auVar8,auVar8,ZEXT816(0x3ff0000000000000));
    lVar6 = 0;
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    pdVar7 = *padVar4;
    for (; lVar6 != 3; lVar6 = lVar6 + 1) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *pdVar7;
      pdVar7 = pdVar7 + 0x11b;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_28[lVar6];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (auVar8._0_8_ * 0.5) / auVar10._0_8_ + 0.5;
      auVar2 = vfmadd213sd_fma(auVar11,auVar9,auVar2);
      local_28[lVar6] = auVar2._0_8_;
    }
    padVar4 = (double (*) [283])((long)padVar4 + 8);
  }
  cie_lab(local_28);
  residual[2] = rgb[2];
  dVar3 = rgb[1];
  *residual = *rgb;
  residual[1] = dVar3;
  cie_lab(residual);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    residual[lVar5] = residual[lVar5] - local_28[lVar5];
  }
  return;
}

Assistant:

void eval_residual(const double *coeffs, const double *rgb, double *residual) {
    double out[3] = {0.0, 0.0, 0.0};

    for (int i = 0; i < CIE_FINE_SAMPLES; ++i) {
        /* Scale lambda to 0..1 range */
        double lambda =
            (lambda_tbl[i] - CIE_LAMBDA_MIN) / (CIE_LAMBDA_MAX - CIE_LAMBDA_MIN);

        /* Polynomial */
        double x = 0.0;
        for (int i = 0; i < 3; ++i)
            x = x * lambda + coeffs[i];

        /* Sigmoid */
        double s = sigmoid(x);

        /* Integrate against precomputed curves */
        for (int j = 0; j < 3; ++j)
            out[j] += rgb_tbl[j][i] * s;
    }
    cie_lab(out);
    memcpy(residual, rgb, sizeof(double) * 3);
    cie_lab(residual);

    for (int j = 0; j < 3; ++j)
        residual[j] -= out[j];
}